

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_curse_type(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  char *name;
  void *pvVar3;
  
  name = parser_getsym(p,"tval");
  wVar1 = tval_find_idx(name);
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar2 = PARSE_ERROR_UNRECOGNISED_TVAL;
    if ((uint)wVar1 < 0x24) {
      *(undefined1 *)(*(long *)((long)pvVar3 + 0x10) + (ulong)(uint)wVar1) = 1;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_curse_type(struct parser *p) {
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if ((tval < 0) || (tval >= TV_MAX)) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	curse->poss[tval] = true;
	return PARSE_ERROR_NONE;
}